

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval-comp.cpp
# Opt level: O1

void __thiscall IntervalComp_plus2_Test::~IntervalComp_plus2_Test(IntervalComp_plus2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IntervalComp, plus2)
{
    auto const e = "x"_s + "y"_s;
    auto const range1 = functionRange(e, "x"_s, interval(1_i, true, 2_i, false));
    EXPECT_EQ(toString(range1), "(COInterval (+ 1 y) (+ 2 y))");
    auto const range1Interval = std::get<impl::Interval>(*range1);

    auto const leftRange = functionRange(range1Interval.first.first, "y"_s, interval(-2_i, false, -1_i, true));
    EXPECT_EQ(toString(leftRange), "(OCInterval -1 0)");

    auto const rightRange = functionRange(range1Interval.second.first, "y"_s, interval(-2_i, false, -1_i, true));
    EXPECT_EQ(toString(rightRange), "(OCInterval 0 1)");
}